

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnI64ConstExpr(BinaryReaderIR *this,uint64_t value)

{
  char *__s;
  Offset OVar1;
  Result RVar2;
  size_t sVar3;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_30;
  
  __s = this->filename_;
  sVar3 = strlen(__s);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x88);
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(undefined4 *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 0x10;
  *(undefined ***)
   local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__Expr_0020d838;
  *(char **)((long)local_30._M_t.
                   super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40) = __s;
  *(size_t *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x48) = sVar3;
  *(Offset *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x50) = OVar1;
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined4 *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x60) = 0xfffffffe;
  *(uint64_t *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x68) = value;
  *(undefined4 *)
   ((long)local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x78) = 0;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_30);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_30._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnI64ConstExpr(uint64_t value) {
  return AppendExpr(MakeUnique<ConstExpr>(Const::I64(value, GetLocation())));
}